

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O0

QList<QWidget_*> * __thiscall QSet<QWidget_*>::values(QSet<QWidget_*> *this)

{
  long lVar1;
  bool bVar2;
  QSet<QWidget_*> *in_RSI;
  parameter_type in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000018;
  QList<QWidget_*> *result;
  const_iterator i;
  parameter_type this_00;
  QList<QWidget_*> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->super_QPaintDevice = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QList<QWidget_*>::QList((QList<QWidget_*> *)0x2d89e0);
  size((QSet<QWidget_*> *)0x2d89ea);
  QList<QWidget_*>::reserve(in_stack_ffffffffffffffd8,in_stack_00000018);
  constBegin(in_RSI);
  while( true ) {
    constEnd(in_RSI);
    bVar2 = const_iterator::operator!=((const_iterator *)this_00,(const_iterator *)in_RDI);
    if (!bVar2) break;
    const_iterator::operator*((const_iterator *)0x2d8a4c);
    QList<QWidget_*>::append((QList<QWidget_*> *)0x2d8a59,in_RDI);
    const_iterator::operator++((const_iterator *)this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QList<QWidget_*> *)in_RDI;
}

Assistant:

Q_OUTOFLINE_TEMPLATE QList<T> QSet<T>::values() const
{
    QList<T> result;
    result.reserve(size());
    typename QSet<T>::const_iterator i = constBegin();
    while (i != constEnd()) {
        result.append(*i);
        ++i;
    }
    return result;
}